

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void AddDrawListToDrawData(ImVector<ImDrawList_*> *out_list,ImDrawList *draw_list)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  ImDrawCmd *pIVar4;
  ImDrawList **ppIVar5;
  ulong uVar6;
  ImDrawList **__dest;
  int iVar7;
  long lVar8;
  int iVar9;
  
  uVar2 = (draw_list->CmdBuffer).Size;
  uVar6 = (ulong)uVar2;
  if (uVar6 != 0) {
    if ((int)uVar2 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                    ,0x50d,"T &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    pIVar4 = (draw_list->CmdBuffer).Data;
    if (((pIVar4[uVar6 - 1].ElemCount != 0) ||
        (pIVar4[uVar6 - 1].UserCallback != (ImDrawCallback)0x0)) ||
       ((draw_list->CmdBuffer).Size = uVar2 - 1, uVar2 - 1 != 0)) {
      uVar2 = (draw_list->VtxBuffer).Size;
      if (((long)(int)uVar2 != 0) &&
         (draw_list->_VtxWritePtr != (draw_list->VtxBuffer).Data + (int)uVar2)) {
        __assert_fail("draw_list->VtxBuffer.Size == 0 || draw_list->_VtxWritePtr == draw_list->VtxBuffer.Data + draw_list->VtxBuffer.Size"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                      ,0xf82,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
      }
      lVar8 = (long)(draw_list->IdxBuffer).Size;
      if ((lVar8 != 0) && (draw_list->_IdxWritePtr != (draw_list->IdxBuffer).Data + lVar8)) {
        __assert_fail("draw_list->IdxBuffer.Size == 0 || draw_list->_IdxWritePtr == draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                      ,0xf83,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
      }
      if (((draw_list->Flags & 4) == 0) && (draw_list->_VtxCurrentIdx != uVar2)) {
        __assert_fail("(int)draw_list->_VtxCurrentIdx == draw_list->VtxBuffer.Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                      ,0xf85,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
      }
      if (0xffff < draw_list->_VtxCurrentIdx) {
        __assert_fail("draw_list->_VtxCurrentIdx < (1 << 16) && \"Too many vertices in ImDrawList using 16-bit indices. Read comment above\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                      ,0xf97,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
      }
      iVar3 = out_list->Capacity;
      if (out_list->Size == iVar3) {
        iVar9 = out_list->Size + 1;
        if (iVar3 == 0) {
          iVar7 = 8;
        }
        else {
          iVar7 = iVar3 / 2 + iVar3;
        }
        if (iVar9 < iVar7) {
          iVar9 = iVar7;
        }
        if (iVar3 < iVar9) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          __dest = (ImDrawList **)(*GImAllocatorAllocFunc)((long)iVar9 << 3,GImAllocatorUserData);
          if (out_list->Data != (ImDrawList **)0x0) {
            memcpy(__dest,out_list->Data,(long)out_list->Size << 3);
            ppIVar5 = out_list->Data;
            if ((ppIVar5 != (ImDrawList **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(ppIVar5,GImAllocatorUserData);
          }
          out_list->Data = __dest;
          out_list->Capacity = iVar9;
        }
      }
      out_list->Data[out_list->Size] = draw_list;
      out_list->Size = out_list->Size + 1;
    }
  }
  return;
}

Assistant:

const char* ImStrchrRange(const char* str, const char* str_end, char c)
{
    const char* p = (const char*)memchr(str, (int)c, str_end - str);
    return p;
}